

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O0

void do_cmd_wiz_edit_player_stat(command_conflict *cmd)

{
  _Bool _Var1;
  wchar_t wVar2;
  char *pcVar3;
  int16_t local_d4;
  int16_t local_d0;
  int local_cc;
  char local_b8 [8];
  char s [80];
  char prompt [80];
  wchar_t newv;
  wchar_t stat;
  command_conflict *cmd_local;
  
  if (edit_player_state != EDIT_PLAYER_BREAK) {
    wVar2 = cmd_get_arg_choice((command *)cmd,"choice",(int *)(prompt + 0x4c));
    if (wVar2 != L'\0') {
      strnfmt(s + 0x48,0x50,"Edit which stat (name or 0-%d): ",4);
      pcVar3 = stat_idx_to_name(L'\0');
      strnfmt(local_b8,0x50,"%s",pcVar3);
      _Var1 = get_string(s + 0x48,local_b8,0x50);
      if (!_Var1) {
        return;
      }
      _Var1 = get_int_from_string(local_b8,(int *)(prompt + 0x4c));
      if ((!_Var1) && (prompt._76_4_ = stat_name_to_idx(local_b8), (int)prompt._76_4_ < L'\0')) {
        return;
      }
      cmd_set_arg_choice((command *)cmd,"choice",prompt._76_4_);
    }
    if ((-1 < (int)prompt._76_4_) && ((int)prompt._76_4_ < 5)) {
      pcVar3 = stat_idx_to_name(prompt._76_4_);
      strnfmt(s + 0x48,0x50,"%s (3-118): ",pcVar3);
      strnfmt(local_b8,0x50,"%d",(ulong)(uint)(int)player->stat_max[(int)prompt._76_4_]);
      _Var1 = get_string(s + 0x48,local_b8,0x50);
      if ((_Var1) && (_Var1 = get_int_from_string(local_b8,(int *)(prompt + 0x48)), _Var1)) {
        if ((int)prompt._72_4_ < 4) {
          local_cc = 3;
        }
        else {
          local_cc._0_1_ = prompt[0x48];
          local_cc._1_1_ = prompt[0x49];
          local_cc._2_1_ = prompt[0x4a];
          local_cc._3_1_ = prompt[0x4b];
        }
        if (local_cc < 0x76) {
          if ((int)prompt._72_4_ < 4) {
            local_d0 = 3;
          }
          else {
            local_d0 = (int16_t)prompt._72_4_;
          }
          local_d4 = local_d0;
        }
        else {
          local_d4 = 0x76;
        }
        player->stat_max[(int)prompt._76_4_] = local_d4;
        player->stat_cur[(int)prompt._76_4_] = local_d4;
        player->upkeep->update = player->upkeep->update | 1;
        player->upkeep->redraw = player->upkeep->redraw | 0x10;
      }
      else {
        edit_player_state = EDIT_PLAYER_BREAK;
      }
    }
  }
  return;
}

Assistant:

void do_cmd_wiz_edit_player_stat(struct command *cmd)
{
	int stat, newv;
	char prompt[80], s[80];

	if (edit_player_state == EDIT_PLAYER_BREAK) return;

	if (cmd_get_arg_choice(cmd, "choice", &stat) != CMD_OK) {
		strnfmt(prompt, sizeof(prompt),
			"Edit which stat (name or 0-%d): ", STAT_MAX - 1);

		/* Set default value. */
		strnfmt(s, sizeof(s), "%s", stat_idx_to_name(0));

		if (!get_string(prompt, s, sizeof(s))) return;
		if (!get_int_from_string(s, &stat)) {
			stat = stat_name_to_idx(s);
			if (stat < 0) {
				return;
			}
		}

		cmd_set_arg_choice(cmd, "choice", stat);
	}

	if (stat < 0 || stat >= STAT_MAX) {
		return;
	}

	strnfmt(prompt, sizeof(prompt), "%s (3-118): ", stat_idx_to_name(stat));

	/* Set default value. */
	strnfmt(s, sizeof(s), "%d", player->stat_max[stat]);

	if (!get_string(prompt, s, sizeof(s)) ||
			!get_int_from_string(s, &newv)) {
		/* Set next editing stage to break. */
		edit_player_state = EDIT_PLAYER_BREAK;
		return;
	}

	/* Limit to the range of [3, 118]. */
	newv = MIN(118, MAX(3, newv));

	player->stat_cur[stat] = player->stat_max[stat] = newv;

	/* Flag what needs to be updated or redrawn. */
	player->upkeep->update |= (PU_BONUS);
	player->upkeep->redraw |= (PR_STATS);
}